

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O0

void getModulePath(char **path,uint *pathLength)

{
  uchar uVar1;
  uint local_28;
  uint local_24;
  uint executablePathDirectoryLength;
  uint executablePathLength;
  char *executablePath;
  uint *pathLength_local;
  char **path_local;
  
  executablePath = (char *)pathLength;
  pathLength_local = (uint *)path;
  uVar1 = checkStringOutParameter(path,pathLength);
  if (uVar1 != '\0') {
    _executablePathDirectoryLength = (char *)0x0;
    local_24 = 0;
    getExecutablePath((char **)&executablePathDirectoryLength,&local_24);
    local_28 = 0;
    getDirectoryPart(_executablePathDirectoryLength,local_24,&local_28);
    copyToStringOutParameter
              (_executablePathDirectoryLength,local_28,(char **)pathLength_local,
               (uint *)executablePath);
    free(_executablePathDirectoryLength);
  }
  return;
}

Assistant:

void getModulePath(char ** path, unsigned int * pathLength)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(path, pathLength))
    {
        return;
    }

    char * executablePath = 0x0;
    unsigned int executablePathLength = 0;
    getExecutablePath(&executablePath, &executablePathLength);
    unsigned int executablePathDirectoryLength = 0;

    getDirectoryPart(executablePath, executablePathLength, &executablePathDirectoryLength);

    copyToStringOutParameter(executablePath, executablePathDirectoryLength, path, pathLength);

    free(executablePath);
}